

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_Sim2CompareZero(uint *p0,int nWords,int fCompl)

{
  int local_24;
  int w;
  int fCompl_local;
  int nWords_local;
  uint *p0_local;
  
  if (fCompl == 0) {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      if (p0[local_24] != 0) {
        return 0;
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < nWords; local_24 = local_24 + 1) {
      if (p0[local_24] != 0xffffffff) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Gia_Sim2CompareZero( unsigned * p0, int nWords, int fCompl )
{
    int w;
    if ( !fCompl )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != 0 )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~0 )
                return 0;
        return 1;
    }
}